

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O1

void scroll_group_translate_coordinates_proc
               (Am_Object *self,Am_Object *for_part,int in_x,int in_y,int *out_x,int *out_y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object v_scroller;
  Am_Object h_scroller;
  Am_Object local_40;
  Am_Object local_38;
  
  pAVar4 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  *out_x = iVar2 + in_x;
  pAVar4 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  *out_y = iVar2 + in_y;
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)self,0x1c3);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)self,0x1c4);
  bVar1 = Am_Object::operator!=(for_part,&local_38);
  if (bVar1) {
    bVar1 = Am_Object::operator!=(for_part,&local_40);
    if (bVar1) {
      pAVar4 = Am_Object::Get(self,0x1bf,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(self,0x11d,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      *out_x = *out_x + (iVar2 - iVar3);
      pAVar4 = Am_Object::Get(self,0x1c0,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(self,0x11e,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      *out_y = *out_y + (iVar2 - iVar3);
    }
  }
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Translate_Coordinates_Method, void,
                 scroll_group_translate_coordinates,
                 (const Am_Object &self, const Am_Object &for_part, int in_x,
                  int in_y, int &out_x, int &out_y))
{
  bool using_constraint = true;
  //first, offset by the origin of the inside of the group
  if (using_constraint) {
    out_x = (int)self.Get(Am_LEFT) + in_x;
    out_y = (int)self.Get(Am_TOP) + in_y;
  } else {
    out_x = (int)self.Get(Am_LEFT) + in_x;
    out_y = (int)self.Get(Am_TOP) + in_y;
  }

  Am_Object h_scroller = self.Get_Object(Am_H_SCROLLER);
  Am_Object v_scroller = self.Get_Object(Am_V_SCROLLER);
  if (for_part != h_scroller && for_part != v_scroller) {
    // then is for something on the inside of the scrolling region
    if (using_constraint) {
      out_x += (int)self.Get(Am_CLIP_LEFT) - (int)self.Get(Am_X_OFFSET);
      out_y += (int)self.Get(Am_CLIP_TOP) - (int)self.Get(Am_Y_OFFSET);
    } else {
      out_x += (int)self.Get(Am_CLIP_LEFT) - (int)self.Get(Am_X_OFFSET);
      out_y += (int)self.Get(Am_CLIP_TOP) - (int)self.Get(Am_Y_OFFSET);
    }
  }
}